

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * uriParameter(char *zFilename,char *zParam)

{
  int iVar1;
  int iVar2;
  char *in_RSI;
  long in_RDI;
  bool bVar3;
  int x;
  char *in_stack_ffffffffffffffd8;
  char *local_10;
  
  iVar1 = sqlite3Strlen30(in_stack_ffffffffffffffd8);
  local_10 = (char *)(in_RDI + (iVar1 + 1));
  while( true ) {
    bVar3 = false;
    if (local_10 != (char *)0x0) {
      bVar3 = *local_10 != '\0';
    }
    if (!bVar3) break;
    iVar1 = strcmp(local_10,in_RSI);
    iVar2 = sqlite3Strlen30(in_stack_ffffffffffffffd8);
    if (iVar1 == 0) {
      return local_10 + (iVar2 + 1);
    }
    iVar1 = sqlite3Strlen30(in_stack_ffffffffffffffd8);
    local_10 = local_10 + (iVar2 + 1) + (iVar1 + 1);
  }
  return (char *)0x0;
}

Assistant:

static const char *uriParameter(const char *zFilename, const char *zParam){
  zFilename += sqlite3Strlen30(zFilename) + 1;
  while( ALWAYS(zFilename!=0) && zFilename[0] ){
    int x = strcmp(zFilename, zParam);
    zFilename += sqlite3Strlen30(zFilename) + 1;
    if( x==0 ) return zFilename;
    zFilename += sqlite3Strlen30(zFilename) + 1;
  }
  return 0;
}